

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O2

void duckdb::CreateSortKeyHelpers::CreateSortKey
               (DataChunk *input,vector<duckdb::OrderModifiers,_true> *modifiers,Vector *result)

{
  reference args;
  const_reference args_2;
  ulong __n;
  vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_true>
  sort_key_data;
  idx_t local_58;
  duckdb local_50 [8];
  vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
  local_48;
  
  local_48.
  super__Vector_base<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.
  super__Vector_base<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (__n = 0; __n < (ulong)((long)(modifiers->
                                    super_vector<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>
                                    ).
                                    super__Vector_base<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(modifiers->
                                    super_vector<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>
                                    ).
                                    super__Vector_base<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 1); __n = __n + 1)
  {
    args = vector<duckdb::Vector,_true>::get<true>(&input->data,__n);
    local_58 = input->count;
    args_2 = vector<duckdb::OrderModifiers,_true>::get<true>(modifiers,__n);
    make_uniq<duckdb::SortKeyVectorData,duckdb::Vector&,unsigned_long,duckdb::OrderModifiers_const&>
              (local_50,args,&local_58,args_2);
    ::std::
    vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,std::default_delete<duckdb::SortKeyVectorData>,true>,std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,std::default_delete<duckdb::SortKeyVectorData>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::SortKeyVectorData,std::default_delete<duckdb::SortKeyVectorData>,true>>
              ((vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,std::default_delete<duckdb::SortKeyVectorData>,true>,std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,std::default_delete<duckdb::SortKeyVectorData>,true>>>
                *)&local_48,
               (unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>
                *)local_50);
    ::std::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>_>::
    ~unique_ptr((unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>_>
                 *)local_50);
  }
  CreateSortKeyInternal
            ((vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_true>
              *)&local_48,modifiers,result,input->count);
  ::std::
  vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void CreateSortKeyHelpers::CreateSortKey(DataChunk &input, const vector<OrderModifiers> &modifiers, Vector &result) {
	vector<unique_ptr<SortKeyVectorData>> sort_key_data;
	D_ASSERT(modifiers.size() == input.ColumnCount());
	for (idx_t r = 0; r < modifiers.size(); r++) {
		sort_key_data.push_back(make_uniq<SortKeyVectorData>(input.data[r], input.size(), modifiers[r]));
	}
	CreateSortKeyInternal(sort_key_data, modifiers, result, input.size());
}